

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O2

int32_t safe_sprintf_s(char **buf,size_t *buf_size,char *fmt,...)

{
  char in_AL;
  bool bVar1;
  int iVar2;
  vw_exception *this;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  string sStack_2a8;
  va_list args;
  undefined1 local_268 [24];
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 local_228;
  undefined8 local_218;
  undefined8 local_208;
  undefined8 local_1f8;
  undefined8 local_1e8;
  undefined8 local_1d8;
  undefined8 local_1c8;
  stringstream __msg;
  ostream local_1a8;
  
  if (in_AL != '\0') {
    local_238 = in_XMM0_Qa;
    local_228 = in_XMM1_Qa;
    local_218 = in_XMM2_Qa;
    local_208 = in_XMM3_Qa;
    local_1f8 = in_XMM4_Qa;
    local_1e8 = in_XMM5_Qa;
    local_1d8 = in_XMM6_Qa;
    local_1c8 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].gp_offset = 0x18;
  args[0].fp_offset = 0x30;
  args[0].reg_save_area = local_268;
  local_250 = in_RCX;
  local_248 = in_R8;
  local_240 = in_R9;
  iVar2 = vsnprintf(*buf,*buf_size,fmt,args);
  if (-1 < iVar2) {
    bVar1 = resize_buf_if_needed(buf,buf_size,(ulong)(iVar2 + 1));
    if (bVar1) {
      args[0].overflow_arg_area = &stack0x00000008;
      args[0].gp_offset = 0x18;
      args[0].fp_offset = 0x30;
      args[0].reg_save_area = local_268;
      vsnprintf(*buf,*buf_size,fmt,args);
    }
    return iVar2;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  std::operator<<(&local_1a8,"Encoding error.");
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_regressor.cc"
             ,0xa9,&sStack_2a8);
  __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

int32_t safe_sprintf_s(char*& buf, size_t& buf_size, const char* fmt, ...)
{
  va_list args;
  va_start(args, fmt);
  int32_t len = vsprintf_s(buf, buf_size, fmt, args);
  va_end(args);
  if (len < 0)
    THROW("Encoding error.");
  if (resize_buf_if_needed(buf, buf_size, len + 1))
  {
    va_start(args, fmt);
    vsprintf_s(buf, buf_size, fmt, args);
    va_end(args);
  }

  return len;
}